

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O0

bool __thiscall despot::Planner::RunStep(Planner *this,Solver *solver,World *world,Logger *logger)

{
  World *pWVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  void *pvVar8;
  double dVar9;
  double update_time;
  double execute_time;
  undefined8 uStack_68;
  bool terminal;
  OBS_TYPE obs;
  double search_time;
  double end_t;
  uint local_3c;
  double dStack_38;
  ACT_TYPE action;
  double start_t;
  double step_start_t;
  Logger *logger_local;
  World *world_local;
  Solver *solver_local;
  Planner *this_local;
  
  step_start_t = (double)logger;
  logger_local = (Logger *)world;
  world_local = (World *)solver;
  solver_local = (Solver *)this;
  Logger::CheckTargetTime(logger);
  start_t = get_time_second();
  dStack_38 = get_time_second();
  end_t._0_4_ = (*world_local->_vptr_World[2])();
  local_3c = end_t._0_4_;
  search_time = get_time_second();
  obs = (OBS_TYPE)(search_time - dStack_38);
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar6 = logging::stream(3);
    poVar7 = std::operator<<(&plVar6->super_ostream,"[RunStep] Time spent in ");
    pWVar1 = world_local;
    if (world_local == (World *)0x0) {
      __cxa_bad_typeid();
    }
    pcVar5 = std::type_info::name((type_info *)pWVar1->_vptr_World[-1]);
    poVar7 = std::operator<<(poVar7,pcVar5);
    poVar7 = std::operator<<(poVar7,"::Search(): ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,(double)obs);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  dStack_38 = get_time_second();
  iVar3 = (*logger_local->_vptr_Logger[6])(logger_local,(ulong)local_3c,&stack0xffffffffffffff98);
  search_time = get_time_second();
  dVar9 = search_time - dStack_38;
  iVar4 = logging::level();
  if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
    plVar6 = logging::stream(3);
    poVar7 = std::operator<<(&plVar6->super_ostream,"[RunStep] Time spent in ExecuteAction(): ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,dVar9);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  dStack_38 = get_time_second();
  (*world_local->_vptr_World[3])(world_local,(ulong)local_3c,uStack_68);
  search_time = get_time_second();
  dVar9 = search_time - dStack_38;
  iVar4 = logging::level();
  if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
    plVar6 = logging::stream(3);
    poVar7 = std::operator<<(&plVar6->super_ostream,"[RunStep] Time spent in Update(): ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,dVar9);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  iVar4 = this->step_;
  this->step_ = iVar4 + 1;
  bVar2 = (**(code **)(*(long *)step_start_t + 0x20))
                    (start_t,step_start_t,iVar4,this->round_,(byte)iVar3 & 1,local_3c,uStack_68);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Planner::RunStep(Solver* solver, World* world, Logger* logger) {

	logger->CheckTargetTime();

	double step_start_t = get_time_second();

	double start_t = get_time_second();
	ACT_TYPE action = solver->Search().action;
	double end_t = get_time_second();
	double search_time = (end_t - start_t);
	logi << "[RunStep] Time spent in " << typeid(*solver).name()
			<< "::Search(): " << search_time << endl;

	OBS_TYPE obs;
	start_t = get_time_second();
	bool terminal = world->ExecuteAction(action, obs);
	end_t = get_time_second();
	double execute_time = (end_t - start_t);
	logi << "[RunStep] Time spent in ExecuteAction(): " << execute_time << endl;

	start_t = get_time_second();
	solver->BeliefUpdate(action, obs);
	end_t = get_time_second();
	double update_time = (end_t - start_t);
	logi << "[RunStep] Time spent in Update(): " << update_time << endl;

	return logger->SummarizeStep(step_++, round_, terminal, action, obs,
			step_start_t);
}